

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  secp256k1_ge *psVar5;
  
  psVar5 = r;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    (psVar5->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((a->x).n + 1);
    psVar5 = (secp256k1_ge *)((psVar5->x).n + 1);
  }
  secp256k1_fe_normalize_weak(&r->y);
  uVar1 = (r->y).n[1];
  uVar2 = (r->y).n[2];
  uVar3 = (r->y).n[3];
  (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
  (r->y).n[1] = 0x3ffffffffffffc - uVar1;
  (r->y).n[2] = 0x3ffffffffffffc - uVar2;
  (r->y).n[3] = 0x3ffffffffffffc - uVar3;
  (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
}